

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::ReadListFile(cmFindPackageCommand *this,string *f,PolicyScopeRule psr)

{
  bool bVar1;
  bool local_5d;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string e;
  bool noPolicyScope;
  PolicyScopeRule psr_local;
  string *f_local;
  cmFindPackageCommand *this_local;
  
  local_5d = (this->PolicyScope & 1U) == 0 || psr == NoPolicyScope;
  e.field_2._M_local_buf[0xb] = local_5d;
  e.field_2._12_4_ = psr;
  bVar1 = cmMakefile::ReadDependentFile
                    ((this->super_cmFindCommon).super_cmCommand.Makefile,f,local_5d);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"Error reading CMake code from \"",&local_49);
    std::allocator<char>::~allocator(&local_49);
    std::__cxx11::string::operator+=((string *)local_48,(string *)f);
    std::__cxx11::string::operator+=((string *)local_48,"\".");
    cmCommand::SetError((cmCommand *)this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::ReadListFile(const std::string& f,
                                        PolicyScopeRule psr)
{
  const bool noPolicyScope = !this->PolicyScope || psr == NoPolicyScope;
  if (this->Makefile->ReadDependentFile(f, noPolicyScope)) {
    return true;
  }
  std::string e = "Error reading CMake code from \"";
  e += f;
  e += "\".";
  this->SetError(e);
  return false;
}